

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7ac08::lower_tess_level_visitor::fix_lhs
          (lower_tess_level_visitor *this,ir_assignment *ir)

{
  void *pvVar1;
  ir_rvalue *lhs;
  glsl_type *type;
  int iVar2;
  void *mem_ctx;
  ir_constant *this_00;
  ir_expression *this_01;
  undefined4 extraout_var;
  
  if (*(int *)((long)(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                     super_ir_hierarchical_visitor.data_enter + 0x18) == 4) {
    mem_ctx = ralloc_parent(this);
    pvVar1 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
             super_ir_hierarchical_visitor.data_enter;
    if (*(int *)((long)pvVar1 + 0x28) != 0x8e) {
      __assert_fail("expr->operation == ir_binop_vector_extract",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x105,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    lhs = *(ir_rvalue **)((long)pvVar1 + 0x30);
    if ((lhs->super_ir_instruction).ir_type != ir_type_dereference_variable) {
      __assert_fail("expr->operands[0]->ir_type == ir_type_dereference_variable",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x106,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    if ((lhs->type != &glsl_type::_vec4_type) && (lhs->type != &glsl_type::_vec2_type)) {
      __assert_fail("(expr->operands[0]->type == glsl_type::vec4_type) || (expr->operands[0]->type == glsl_type::vec2_type)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x108,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    this_00 = (ir_constant *)
              (**(code **)(**(long **)((long)pvVar1 + 0x38) + 0x30))
                        (*(long **)((long)pvVar1 + 0x38),mem_ctx,0);
    if (this_00 == (ir_constant *)0x0) {
      this_01 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
      type = *(glsl_type **)(*(long *)((long)pvVar1 + 0x30) + 0x20);
      iVar2 = (*(lhs->super_ir_instruction)._vptr_ir_instruction[4])(lhs,mem_ctx,0);
      ir_expression::ir_expression
                (this_01,0x96,type,(ir_rvalue *)CONCAT44(extraout_var,iVar2),
                 (ir_rvalue *)
                 (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.data_leave,*(ir_rvalue **)((long)pvVar1 + 0x38),
                 (ir_rvalue *)0x0);
      (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
      data_leave = this_01;
      ir_assignment::set_lhs((ir_assignment *)this,lhs);
      *(byte *)&this->old_tess_level_outer_var =
           (*(byte *)&this->old_tess_level_outer_var & 0xf0 |
           (byte)(-1 << (*(byte *)(*(long *)(*(long *)((long)pvVar1 + 0x30) + 0x20) + 8) & 0x1f)) &
           0xf) ^ 0xf;
    }
    else {
      ir_assignment::set_lhs((ir_assignment *)this,lhs);
      iVar2 = ir_constant::get_int_component(this_00,0);
      *(byte *)&this->old_tess_level_outer_var =
           *(byte *)&this->old_tess_level_outer_var & 0xf0 | (byte)(1 << ((byte)iVar2 & 0x1f)) & 0xf
      ;
    }
  }
  return;
}

Assistant:

void
lower_tess_level_visitor::fix_lhs(ir_assignment *ir)
{
   if (ir->lhs->ir_type != ir_type_expression)
      return;
   void *mem_ctx = ralloc_parent(ir);
   ir_expression *const expr = (ir_expression *) ir->lhs;

   /* The expression must be of the form:
    *
    *     (vector_extract gl_TessLevel*MESA, j).
    */
   assert(expr->operation == ir_binop_vector_extract);
   assert(expr->operands[0]->ir_type == ir_type_dereference_variable);
   assert((expr->operands[0]->type == glsl_type::vec4_type) ||
          (expr->operands[0]->type == glsl_type::vec2_type));

   ir_dereference *const new_lhs = (ir_dereference *) expr->operands[0];

   ir_constant *old_index_constant =
      expr->operands[1]->constant_expression_value(mem_ctx);
   if (!old_index_constant) {
      ir->rhs = new(mem_ctx) ir_expression(ir_triop_vector_insert,
                                           expr->operands[0]->type,
                                           new_lhs->clone(mem_ctx, NULL),
                                           ir->rhs,
                                           expr->operands[1]);
   }
   ir->set_lhs(new_lhs);

   if (old_index_constant) {
      /* gl_TessLevel* is being accessed via a constant index.  Don't bother
       * creating a vector insert op. Just use a write mask.
       */
      ir->write_mask = 1 << old_index_constant->get_int_component(0);
   } else {
      ir->write_mask = (1 << expr->operands[0]->type->vector_elements) - 1;
   }
}